

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::updateVelocity
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *sol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FabType FVar16;
  uint uVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  void *__s;
  bool bVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  Real facz;
  Real facy;
  Real facx;
  MFIter mfi;
  long local_340;
  Box local_2fc;
  long local_2e0;
  long local_2d8;
  double *local_2d0;
  long local_2c8;
  double *local_2c0;
  undefined4 local_2b4;
  MLNodeLaplacian *local_2b0;
  FabArray<amrex::FArrayBox> *local_2a8;
  FabArray<amrex::EBCellFlagFab> *local_2a0;
  long local_298;
  long local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  int local_270;
  int local_26c;
  Array4<double> local_268;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_228;
  undefined8 *local_220;
  double local_218;
  double local_210;
  double local_208;
  Array4<const_double> local_200;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_190;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_188;
  ulong local_180;
  long local_178;
  long local_170;
  ulong local_168;
  double *local_160;
  long local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  MFIter local_d0;
  Array4<const_double> local_70;
  
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    local_298 = 0;
    local_2b0 = this;
    local_228 = vel;
    local_188 = sol;
    do {
      local_220 = *(undefined8 **)
                   &(local_2b0->m_sigma).
                    super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_298].
                    super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                    .
                    super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
      ;
      lVar18 = *(long *)&(local_2b0->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_298].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_208 = *(double *)(lVar18 + 0x38);
      local_210 = *(double *)(lVar18 + 0x40);
      local_218 = *(double *)(lVar18 + 0x48);
      plVar9 = *(long **)&(local_2b0->super_MLNodeLinOp).super_MLLinOp.m_factory.
                          super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_298].
                          super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      lVar18 = *plVar9;
      local_2b4 = (undefined4)CONCAT71((int7)((ulong)plVar9 >> 8),1);
      if (lVar18 == 0) {
        local_2a0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_2a8 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      else {
        lVar18 = __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
        local_2a0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_2a8 = (FabArray<amrex::FArrayBox> *)0x0;
        if (lVar18 != 0) {
          local_2a0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar18 + 0xd8))
          ;
          local_2a8 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar18 + 0xd8))->
                       super_FabArray<amrex::FArrayBox>;
          local_2b4 = 0;
        }
      }
      local_190._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (local_2b0->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_298]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      MFIter::MFIter(&local_d0,
                     (FabArrayBase *)
                     (local_228->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_298],true);
      if (local_d0.currentIndex < local_d0.endIndex) {
        local_198 = local_208 * 0.25;
        local_1a0 = local_210 * 0.25;
        local_1a8 = local_218 * 0.25;
        local_1b0 = local_208 * -0.25;
        local_1b8 = local_210 * -0.25;
        local_1c0 = local_218 * -0.25;
        do {
          MFIter::tilebox(&local_2fc,&local_d0);
          lVar18 = local_298;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_268,
                     &(local_228->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_298]->
                      super_FabArray<amrex::FArrayBox>,&local_d0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_200,
                     &(local_188->
                      super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                      ).
                      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar18]->
                      super_FabArray<amrex::FArrayBox>,&local_d0);
          if ((char)local_2b4 == '\0') {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_150,(FabArray<amrex::FArrayBox> *)*local_220,&local_d0);
            piVar19 = &local_d0.currentIndex;
            if (local_d0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar19 = ((local_d0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_d0.currentIndex;
            }
            FVar16 = EBCellFlagFab::getType
                               ((local_2a0->m_fabs_v).
                                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[*piVar19],&local_2fc);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_70,local_2a8,&local_d0);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_110,
                       (FabArray<amrex::FArrayBox> *)
                       local_190._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_d0);
            iVar15 = local_2fc.bigend.vect[2];
            iVar14 = local_2fc.bigend.vect[1];
            iVar13 = local_2fc.bigend.vect[0];
            iVar12 = local_2fc.smallend.vect[2];
            iVar10 = local_2fc.smallend.vect[1];
            iVar27 = local_2fc.smallend.vect[0];
            if (FVar16 == singlevalued) {
              if (local_2fc.smallend.vect[2] <= local_2fc.bigend.vect[2]) {
                local_168 = (ulong)(uint)local_2fc.bigend.vect[0];
                local_180 = (ulong)(uint)local_2fc.bigend.vect[1];
                local_170 = (long)local_2fc.smallend.vect[1];
                local_178 = (long)local_2fc.smallend.vect[0];
                local_26c = local_2fc.bigend.vect[1] + 1;
                local_270 = local_2fc.bigend.vect[2] + 1;
                iVar27 = local_2fc.smallend.vect[2];
                do {
                  if (local_2fc.smallend.vect[1] <= local_2fc.bigend.vect[1]) {
                    local_288 = (long)local_70.begin.y;
                    local_290 = local_70.jstride;
                    local_158 = (long)iVar27;
                    local_160 = local_70.p + (local_158 - local_70.begin.z) * local_70.kstride;
                    local_280 = CONCAT44(local_280._4_4_,iVar27 + 1);
                    lVar18 = local_170;
                    do {
                      if (local_2fc.bigend.vect[0] < local_2fc.smallend.vect[0]) {
                        uVar30 = lVar18 + 1U & 0xffffffff;
                      }
                      else {
                        lVar31 = (lVar18 - local_200.begin.y) * local_200.jstride;
                        lVar29 = (iVar27 - local_200.begin.z) * local_200.kstride;
                        uVar30 = lVar18 + 1;
                        lVar36 = ((int)uVar30 - local_200.begin.y) * local_200.jstride;
                        lVar28 = ((iVar27 + 1) - local_200.begin.z) * local_200.kstride;
                        lVar33 = (lVar18 - local_110.begin.y) * local_110.jstride;
                        lVar35 = (local_158 - local_110.begin.z) * local_110.kstride;
                        local_2d0 = local_150.p +
                                    (lVar18 - local_150.begin.y) * local_150.jstride +
                                    (local_158 - local_150.begin.z) * local_150.kstride;
                        lVar24 = (lVar18 - local_268.begin.y) * local_268.jstride;
                        lVar26 = (local_158 - local_268.begin.z) * local_268.kstride;
                        local_2c0 = (double *)(long)local_150.begin.x;
                        local_2c8 = (long)local_110.begin.x;
                        local_2d8 = local_110.nstride * 0x38;
                        local_2e0 = local_110.nstride * 0x30;
                        lVar21 = local_178;
                        do {
                          dVar40 = local_160[(lVar18 - local_288) * local_70.jstride +
                                             (lVar21 - local_70.begin.x)];
                          iVar10 = (int)lVar21;
                          if ((dVar40 != 0.0) || (NAN(dVar40))) {
                            lVar20 = lVar21 - local_200.begin.x;
                            dVar1 = local_200.p[lVar31 + lVar20 + lVar29];
                            lVar22 = (long)((iVar10 + 1) - local_200.begin.x);
                            dVar2 = local_200.p[lVar31 + lVar20 + lVar28];
                            dVar3 = local_200.p[lVar31 + lVar22 + lVar29];
                            dVar4 = local_200.p[lVar36 + lVar20 + lVar29];
                            dVar5 = local_200.p[lVar36 + lVar22 + lVar29];
                            dVar6 = local_200.p[lVar31 + lVar22 + lVar28];
                            dVar7 = local_200.p[lVar36 + lVar20 + lVar28];
                            dVar8 = local_200.p[lVar36 + lVar22 + lVar28];
                            dVar39 = ((dVar8 - dVar7) - dVar6) + dVar2;
                            dVar42 = ((((dVar5 + dVar39) - dVar4) - dVar3) + dVar1) / dVar40;
                            dVar41 = ((((((dVar6 + (dVar8 - dVar7)) - dVar2) - dVar5) + dVar4) -
                                      dVar3) + dVar1) / dVar40;
                            dVar38 = ((((((dVar7 + dVar8) - dVar6) - dVar2) - dVar5) - dVar4) +
                                      dVar3 + dVar1) / dVar40;
                            dVar40 = (((dVar39 - dVar5) + dVar4 + dVar3) - dVar1) / dVar40;
                            lVar20 = lVar21 - (long)local_2c0;
                            lVar22 = lVar21 - local_2c8;
                            lVar25 = lVar21 - local_268.begin.x;
                            local_268.p[lVar24 + lVar26 + lVar25] =
                                 local_268.p[lVar24 + lVar26 + lVar25] -
                                 local_2d0[lVar20] * local_208 *
                                 (local_110.p[lVar33 + lVar35 + lVar22 + local_110.nstride * 8] *
                                  dVar40 + local_110.p
                                           [lVar33 + lVar35 + lVar22 + local_110.nstride * 2] * 0.5
                                           * dVar41 +
                                           local_110.p[lVar33 + lVar35 + lVar22 + local_110.nstride]
                                           * 0.5 * dVar42 +
                                           (((((((dVar3 - dVar1) - dVar4) + dVar5) - dVar2) + dVar6)
                                            - dVar7) + dVar8) * 0.25);
                            local_268.p[lVar24 + lVar26 + lVar25 + local_268.nstride] =
                                 local_268.p[lVar24 + lVar26 + lVar25 + local_268.nstride] -
                                 local_2d0[lVar20] * local_210 *
                                 (local_110.p[lVar33 + lVar35 + lVar22 + local_110.nstride * 7] *
                                  dVar40 + local_110.p
                                           [lVar33 + lVar35 + lVar22 + local_110.nstride * 2] * 0.5
                                           * dVar38 +
                                           local_110.p[lVar33 + lVar35 + lVar22] * 0.5 * dVar42 +
                                           (((((-dVar1 - dVar3) + dVar4 + dVar5) - dVar2) - dVar6) +
                                            dVar7 + dVar8) * 0.25);
                            local_268.p[lVar24 + lVar26 + lVar25 + local_268.nstride * 2] =
                                 local_268.p[lVar24 + lVar26 + lVar25 + local_268.nstride * 2] -
                                 local_2d0[lVar20] * local_218 *
                                 (dVar40 * local_110.p
                                           [lVar33 + lVar35 + lVar22 + local_110.nstride * 6] +
                                 local_110.p[lVar33 + lVar35 + lVar22 + local_110.nstride] * 0.5 *
                                 dVar38 + local_110.p[lVar33 + lVar35 + lVar22] * 0.5 * dVar41 +
                                          ((((-dVar1 - dVar3) - dVar4) - dVar5) + dVar2 + dVar6 +
                                           dVar7 + dVar8) * 0.25);
                          }
                          else {
                            lVar20 = lVar21 - local_268.begin.x;
                            local_268.p[lVar24 + lVar26 + lVar20 + local_268.nstride * 2] = 0.0;
                            local_268.p[lVar24 + lVar26 + lVar20 + local_268.nstride] = 0.0;
                            local_268.p[lVar24 + lVar26 + lVar20] = 0.0;
                          }
                          lVar21 = lVar21 + 1;
                          local_278 = uVar30;
                        } while (iVar10 + 1 != local_2fc.bigend.vect[0] + 1U);
                      }
                      lVar18 = lVar18 + 1;
                    } while ((int)uVar30 != local_26c);
                  }
                  iVar27 = iVar27 + 1;
                } while (iVar27 != local_270);
              }
            }
            else {
              if (FVar16 != covered) goto LAB_006b5f80;
              lVar24 = (long)local_2fc.smallend.vect[0];
              lVar21 = (long)local_2fc.smallend.vect[1];
              uVar17 = local_2fc.bigend.vect[0] - local_2fc.smallend.vect[0];
              iVar23 = local_2fc.bigend.vect[1] - local_2fc.smallend.vect[1];
              local_340 = 0;
              lVar18 = 0;
              do {
                iVar11 = iVar12;
                if (iVar12 <= iVar15) {
                  do {
                    if (iVar10 <= iVar14) {
                      lVar36 = local_268.jstride * 8;
                      __s = (void *)((long)local_268.p +
                                    local_268.nstride * local_340 +
                                    (lVar21 - local_268.begin.y) * lVar36 +
                                    (iVar11 - local_268.begin.z) * local_268.kstride * 8 +
                                    (long)local_268.begin.x * -8 + lVar24 * 8);
                      iVar34 = iVar23 + 1;
                      do {
                        if (iVar27 <= iVar13) {
                          memset(__s,0,(ulong)uVar17 * 8 + 8);
                        }
                        __s = (void *)((long)__s + lVar36);
                        iVar34 = iVar34 + -1;
                      } while (iVar34 != 0);
                    }
                    bVar37 = iVar11 != iVar15;
                    iVar11 = iVar11 + 1;
                  } while (bVar37);
                }
                lVar18 = lVar18 + 1;
                local_340 = local_340 + 8;
              } while (lVar18 != 3);
            }
          }
          else {
LAB_006b5f80:
            if ((FabArray<amrex::FArrayBox> *)*local_220 == (FabArray<amrex::FArrayBox> *)0x0) {
              if (local_2fc.smallend.vect[2] <= local_2fc.bigend.vect[2]) {
                local_2d0 = (double *)(ulong)(uint)local_2fc.bigend.vect[1];
                local_2d8 = (long)local_2fc.smallend.vect[1];
                dVar40 = local_2b0->m_const_sigma;
                local_2e0 = (long)local_2fc.smallend.vect[0] * 8;
                local_2c8 = CONCAT44(local_2c8._4_4_,local_2fc.bigend.vect[2] + 1);
                iVar27 = local_2fc.smallend.vect[2];
                do {
                  if (local_2fc.smallend.vect[1] <= local_2fc.bigend.vect[1]) {
                    local_2c0 = (double *)CONCAT44(local_2c0._4_4_,iVar27 + 1);
                    lVar24 = (long)local_268.begin.x;
                    lVar21 = (iVar27 - local_268.begin.z) * local_268.kstride;
                    lVar36 = (long)((iVar27 + 1) - local_200.begin.z) * local_200.kstride * 8 +
                             (long)local_200.begin.x * -8;
                    lVar31 = local_200.kstride * 8 * (long)(iVar27 - local_200.begin.z) +
                             (long)local_200.begin.x * -8;
                    lVar18 = local_2d8;
                    do {
                      iVar10 = (int)lVar18;
                      if (local_2fc.smallend.vect[0] <= local_2fc.bigend.vect[0]) {
                        lVar26 = (lVar18 - local_268.begin.y) * local_268.jstride * 8;
                        lVar29 = lVar26 + lVar21 * 8 + lVar24 * -8 + local_2e0;
                        lVar33 = lVar26 + local_268.nstride * 8 + lVar21 * 8 + lVar24 * -8 +
                                          local_2e0;
                        lVar26 = lVar26 + local_268.nstride * 0x10 + lVar21 * 8 + lVar24 * -8 +
                                          local_2e0;
                        lVar35 = (lVar18 - local_200.begin.y) * local_200.jstride * 8;
                        lVar28 = lVar35 + lVar36 + local_2e0 + 8;
                        lVar35 = lVar35 + lVar31 + local_2e0 + 8;
                        lVar22 = (long)((iVar10 + 1) - local_200.begin.y) * local_200.jstride * 8;
                        lVar20 = lVar22 + lVar36 + local_2e0;
                        lVar22 = lVar22 + lVar31 + local_2e0;
                        lVar25 = 0;
                        do {
                          *(double *)((long)local_268.p + lVar25 * 8 + lVar29) =
                               (((((((*(double *)((long)local_200.p + lVar25 * 8 + lVar35) -
                                     *(double *)((long)local_200.p + lVar25 * 8 + lVar35 + -8)) -
                                    *(double *)((long)local_200.p + lVar25 * 8 + lVar22)) +
                                   *(double *)((long)local_200.p + lVar25 * 8 + lVar22 + 8)) -
                                  *(double *)((long)local_200.p + lVar25 * 8 + lVar28 + -8)) +
                                 *(double *)((long)local_200.p + lVar25 * 8 + lVar28)) -
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar20)) +
                               *(double *)((long)local_200.p + lVar25 * 8 + lVar20 + 8)) *
                               local_1b0 * dVar40 +
                               *(double *)((long)local_268.p + lVar25 * 8 + lVar29);
                          *(double *)((long)local_268.p + lVar25 * 8 + lVar33) =
                               (((((-*(double *)((long)local_200.p + lVar25 * 8 + lVar35 + -8) -
                                   *(double *)((long)local_200.p + lVar25 * 8 + lVar35)) +
                                   *(double *)((long)local_200.p + lVar25 * 8 + lVar22) +
                                  *(double *)((long)local_200.p + lVar25 * 8 + lVar22 + 8)) -
                                 *(double *)((long)local_200.p + lVar25 * 8 + lVar28 + -8)) -
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar28)) +
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar20) +
                               *(double *)((long)local_200.p + lVar25 * 8 + lVar20 + 8)) *
                               local_1b8 * dVar40 +
                               *(double *)((long)local_268.p + lVar25 * 8 + lVar33);
                          *(double *)((long)local_268.p + lVar25 * 8 + lVar26) =
                               ((((-*(double *)((long)local_200.p + lVar25 * 8 + lVar35 + -8) -
                                  *(double *)((long)local_200.p + lVar25 * 8 + lVar35)) -
                                 *(double *)((long)local_200.p + lVar25 * 8 + lVar22)) -
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar22 + 8)) +
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar28 + -8) +
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar28) +
                                *(double *)((long)local_200.p + lVar25 * 8 + lVar20) +
                               *(double *)((long)local_200.p + lVar25 * 8 + lVar20 + 8)) *
                               dVar40 * local_1c0 +
                               *(double *)((long)local_268.p + lVar25 * 8 + lVar26);
                          lVar25 = lVar25 + 1;
                        } while ((local_2fc.bigend.vect[0] - local_2fc.smallend.vect[0]) + 1 !=
                                 (int)lVar25);
                      }
                      lVar18 = lVar18 + 1;
                    } while (iVar10 + 1 != local_2fc.bigend.vect[1] + 1U);
                  }
                  iVar27 = iVar27 + 1;
                } while (iVar27 != local_2fc.bigend.vect[2] + 1);
              }
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_150,(FabArray<amrex::FArrayBox> *)*local_220,&local_d0);
              if (local_2fc.smallend.vect[2] <= local_2fc.bigend.vect[2]) {
                local_280 = (ulong)(uint)local_2fc.bigend.vect[1];
                local_288 = (long)local_2fc.smallend.vect[1];
                local_290 = (long)local_2fc.smallend.vect[0] * 8;
                local_278 = CONCAT44(local_278._4_4_,local_2fc.bigend.vect[2] + 1);
                iVar27 = local_2fc.smallend.vect[2];
                do {
                  if (local_2fc.smallend.vect[1] <= local_2fc.bigend.vect[1]) {
                    local_2e0 = CONCAT44(local_2e0._4_4_,iVar27 + 1);
                    lVar31 = (long)local_268.begin.x;
                    lVar24 = (iVar27 - local_268.begin.z) * local_268.kstride;
                    local_2c0 = local_268.p + (long)local_2fc.smallend.vect[0] + (lVar24 - lVar31);
                    lVar36 = (long)((iVar27 + 1) - local_200.begin.z) * local_200.kstride * 8 +
                             (long)local_200.begin.x * -8;
                    local_2c8 = (long)local_200.p + lVar36 + local_290 + 8;
                    lVar21 = local_200.kstride * 8 * (long)(iVar27 - local_200.begin.z) +
                             (long)local_200.begin.x * -8;
                    local_2d0 = (double *)((long)local_200.p + lVar21 + local_290 + 8);
                    local_2d8 = (long)local_268.begin.y;
                    lVar18 = local_288;
                    do {
                      iVar10 = (int)lVar18;
                      if (local_2fc.smallend.vect[0] <= local_2fc.bigend.vect[0]) {
                        lVar35 = (lVar18 - local_150.begin.y) * local_150.jstride * 8 +
                                 (iVar27 - local_150.begin.z) * local_150.kstride * 8 +
                                 (long)local_150.begin.x * -8 + local_290;
                        lVar25 = (lVar18 - local_2d8) * local_268.jstride * 8;
                        lVar29 = lVar25 + local_268.nstride * 8 + lVar24 * 8 + lVar31 * -8 +
                                          local_290;
                        lVar33 = lVar25 + local_268.nstride * 0x10 + lVar24 * 8 + lVar31 * -8 +
                                          local_290;
                        lVar20 = (lVar18 - local_200.begin.y) * local_200.jstride * 8;
                        lVar22 = local_2c8 + lVar20;
                        lVar28 = (long)((iVar10 + 1) - local_200.begin.y) * local_200.jstride * 8;
                        lVar26 = lVar28 + lVar36 + local_290;
                        lVar28 = lVar28 + lVar21 + local_290;
                        lVar32 = 0;
                        do {
                          *(double *)((long)local_2c0 + lVar32 * 8 + lVar25) =
                               *(double *)((long)local_2c0 + lVar32 * 8 + lVar25) -
                               *(double *)((long)local_150.p + lVar32 * 8 + lVar35) * local_198 *
                               (((((((*(double *)((long)local_2d0 + lVar32 * 8 + lVar20) -
                                     *(double *)((long)local_2d0 + lVar32 * 8 + lVar20 + -8)) -
                                    *(double *)((long)local_200.p + lVar32 * 8 + lVar28)) +
                                   *(double *)((long)local_200.p + lVar32 * 8 + lVar28 + 8)) -
                                  *(double *)(lVar22 + -8 + lVar32 * 8)) +
                                 *(double *)(lVar22 + lVar32 * 8)) -
                                *(double *)((long)local_200.p + lVar32 * 8 + lVar26)) +
                               *(double *)((long)local_200.p + lVar32 * 8 + lVar26 + 8));
                          *(double *)((long)local_268.p + lVar32 * 8 + lVar29) =
                               *(double *)((long)local_268.p + lVar32 * 8 + lVar29) -
                               *(double *)((long)local_150.p + lVar32 * 8 + lVar35) * local_1a0 *
                               (((((-*(double *)((long)local_2d0 + lVar32 * 8 + lVar20 + -8) -
                                   *(double *)((long)local_2d0 + lVar32 * 8 + lVar20)) +
                                   *(double *)((long)local_200.p + lVar32 * 8 + lVar28) +
                                  *(double *)((long)local_200.p + lVar32 * 8 + lVar28 + 8)) -
                                 *(double *)(lVar22 + -8 + lVar32 * 8)) -
                                *(double *)(lVar22 + lVar32 * 8)) +
                                *(double *)((long)local_200.p + lVar32 * 8 + lVar26) +
                               *(double *)((long)local_200.p + lVar32 * 8 + lVar26 + 8));
                          *(double *)((long)local_268.p + lVar32 * 8 + lVar33) =
                               *(double *)((long)local_268.p + lVar32 * 8 + lVar33) -
                               *(double *)((long)local_150.p + lVar32 * 8 + lVar35) * local_1a8 *
                               ((((-*(double *)((long)local_2d0 + lVar32 * 8 + lVar20 + -8) -
                                  *(double *)((long)local_2d0 + lVar32 * 8 + lVar20)) -
                                 *(double *)((long)local_200.p + lVar32 * 8 + lVar28)) -
                                *(double *)((long)local_200.p + lVar32 * 8 + lVar28 + 8)) +
                                *(double *)(lVar22 + -8 + lVar32 * 8) +
                                *(double *)(lVar22 + lVar32 * 8) +
                                *(double *)((long)local_200.p + lVar32 * 8 + lVar26) +
                               *(double *)((long)local_200.p + lVar32 * 8 + lVar26 + 8));
                          lVar32 = lVar32 + 1;
                        } while ((local_2fc.bigend.vect[0] - local_2fc.smallend.vect[0]) + 1 !=
                                 (int)lVar32);
                      }
                      lVar18 = lVar18 + 1;
                    } while (iVar10 + 1 != local_2fc.bigend.vect[1] + 1U);
                  }
                  iVar27 = iVar27 + 1;
                } while (iVar27 != local_2fc.bigend.vect[2] + 1);
              }
            }
          }
          MFIter::operator++(&local_d0);
        } while (local_d0.currentIndex < local_d0.endIndex);
      }
      MFIter::~MFIter(&local_d0);
      local_298 = local_298 + 1;
    } while (local_298 < (local_2b0->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::updateVelocity (const Vector<MultiFab*>& vel, const Vector<MultiFab const*>& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        const auto& sigma = m_sigma[amrlev][0][0];
        const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiFab* intg = m_integral[amrlev].get();
#endif
        for (MFIter mfi(*vel[amrlev], TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& varr = vel[amrlev]->array(mfi);
            Array4<Real const> const& solarr = sol[amrlev]->const_array(mfi);
#ifdef AMREX_USE_EB
            bool regular = !factory;
            if (factory)
            {
                Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
                auto type = (*flags)[mfi].getType(bx);
                Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                Array4<Real const> const& intgarr = intg->const_array(mfi);
                if (type == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, AMREX_SPACEDIM, i, j, k, n,
                    {
                        varr(i,j,k,n) = 0.0;
                    });
                }
                else if (type == FabType::singlevalued)
                {
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_mknewu_eb(i,j,k, varr, solarr, sigmaarr, vfracarr, intgarr, dxinv);
                    });
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
                if (sigma) {
                    Array4<Real const> const& sigmaarr = sigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu(i,j,k,varr,solarr,sigmaarr,dxinv);
                    });
#endif
                } else {
                    Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_mknewu_c(i,j,k,varr,solarr,const_sigma,dxinv);
                    });
#endif
                }
            }
        }
    }
}